

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

Quat<float> * __thiscall
Imath_3_2::Quat<float>::setRotation(Quat<float> *this,Vec3<float> *from,Vec3<float> *to)

{
  float fVar1;
  Vec3<float> f0;
  Vec3<float> t0;
  Vec3<float> h0;
  Vec3<float> local_68;
  Quat<float> local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  Vec3<float> local_38;
  Vec3<float> local_2c;
  
  Vec3<float>::normalized(&local_68);
  Vec3<float>::normalized(&local_38);
  if (0.0 <= local_68.z * local_38.z + local_68.x * local_38.x + local_68.y * local_38.y) {
    setRotationInternal(this,&local_68,&local_38,this);
  }
  else {
    local_58.v.x = local_68.y + local_38.y;
    local_58.r = local_68.x + local_38.x;
    local_58.v.y = local_68.z + local_38.z;
    Vec3<float>::normalized(&local_2c);
    fVar1 = local_2c.z * local_2c.z + local_2c.x * local_2c.x + local_2c.y * local_2c.y;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      setRotationInternal(this,&local_68,&local_2c,this);
      local_58.r = 1.0;
      local_58.v.x = 0.0;
      local_58.v.y = 0.0;
      local_58.v.z = 0.0;
      setRotationInternal(this,&local_2c,&local_38,&local_58);
      operator*=(this,&local_58);
    }
    else {
      this->r = 0.0;
      if ((local_68.y * local_68.y < local_68.x * local_68.x) ||
         (local_68.z * local_68.z < local_68.x * local_68.x)) {
        if (local_68.y * local_68.y <= local_68.z * local_68.z) {
          fStack_40 = local_68.y * -0.0 + local_68.x;
          local_48 = local_68.y * 0.0 + -local_68.z;
          fStack_44 = local_68.z * 0.0 + local_68.x * -0.0;
        }
        else {
          local_48 = local_68.z * -0.0 + local_68.y;
          fStack_44 = local_68.z * 0.0 + -local_68.x;
          fStack_40 = local_68.x * 0.0 + local_68.y * -0.0;
        }
      }
      else {
        local_48 = local_68.y * 0.0 + local_68.z * -0.0;
        fStack_44 = local_68.z - local_68.x * 0.0;
        fStack_40 = local_68.x * 0.0 - local_68.y;
      }
      Vec3<float>::normalized((Vec3<float> *)&local_58);
      (this->v).x = local_58.r;
      (this->v).y = local_58.v.x;
      (this->v).z = local_58.v.y;
    }
  }
  return this;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Quat<T>&
Quat<T>::setRotation (const Vec3<T>& from, const Vec3<T>& to) IMATH_NOEXCEPT
{
    //
    // Create a quaternion that rotates vector from into vector to,
    // such that the rotation is around an axis that is the cross
    // product of from and to.
    //
    // This function calls function setRotationInternal(), which is
    // numerically accurate only for rotation angles that are not much
    // greater than pi/2.  In order to achieve good accuracy for angles
    // greater than pi/2, we split large angles in half, and rotate in
    // two steps.
    //

    //
    // Normalize from and to, yielding f0 and t0.
    //

    Vec3<T> f0 = from.normalized ();
    Vec3<T> t0 = to.normalized ();

    if ((f0 ^ t0) >= 0)
    {
        //
        // The rotation angle is less than or equal to pi/2.
        //

        setRotationInternal (f0, t0, *this);
    }
    else
    {
        //
        // The angle is greater than pi/2.  After computing h0,
        // which is halfway between f0 and t0, we rotate first
        // from f0 to h0, then from h0 to t0.
        //

        Vec3<T> h0 = (f0 + t0).normalized ();

        if ((h0 ^ h0) != 0)
        {
            setRotationInternal (f0, h0, *this);

            Quat<T> q;
            setRotationInternal (h0, t0, q);

            *this *= q;
        }
        else
        {
            //
            // f0 and t0 point in exactly opposite directions.
            // Pick an arbitrary axis that is orthogonal to f0,
            // and rotate by pi.
            //

            r = T (0);

            Vec3<T> f02 = f0 * f0;

            if (f02.x <= f02.y && f02.x <= f02.z)
                v = (f0 % Vec3<T> (1, 0, 0)).normalized ();
            else if (f02.y <= f02.z)
                v = (f0 % Vec3<T> (0, 1, 0)).normalized ();
            else
                v = (f0 % Vec3<T> (0, 0, 1)).normalized ();
        }
    }

    return *this;
}